

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::emplace<OrderedScreen>
          (QGenericArrayOps<OrderedScreen> *this,qsizetype i,OrderedScreen *args)

{
  OrderedScreen **ppOVar1;
  qsizetype *pqVar2;
  QSizeF *pQVar3;
  drmModePropertyBlobPtr *pp_Var4;
  QKmsPlane **ppQVar5;
  Data *pDVar6;
  OrderedScreen *pOVar7;
  QPlatformScreen *pQVar8;
  undefined8 uVar9;
  Data *pDVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  Data *pDVar13;
  _drmModeModeInfo *p_Var14;
  Data *pDVar15;
  QKmsPlane *pQVar16;
  undefined1 uVar17;
  qreal qVar18;
  qreal qVar19;
  undefined8 uVar20;
  drmModePropertyPtr p_Var21;
  drmModePropertyBlobPtr p_Var22;
  QSize QVar23;
  OrderedScreen *pOVar24;
  Representation RVar25;
  uint32_t uVar26;
  int iVar27;
  int iVar28;
  undefined4 uVar29;
  undefined3 uVar30;
  uint32_t uVar31;
  undefined7 uVar32;
  undefined3 uVar33;
  bool bVar34;
  undefined3 uVar35;
  uint32_t uVar36;
  bool bVar37;
  uint32_t uVar38;
  qsizetype qVar39;
  Data *pDVar40;
  char16_t *pcVar41;
  qsizetype qVar42;
  qsizetype qVar43;
  long in_FS_OFFSET;
  bool bVar44;
  Inserter local_188;
  OrderedScreen local_138;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QArrayDataPointer<OrderedScreen>).d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0013a0ff:
    memcpy(&local_138,&DAT_001485c0,0xb0);
    pQVar8 = args->screen;
    uVar9._0_4_ = (args->vinfo).virtualIndex;
    uVar9._4_4_ = (args->vinfo).virtualPos.xp;
    local_138.vinfo._8_5_ =
         SUB85((ulong)*(undefined8 *)((long)&(args->vinfo).virtualPos.xp.m_i + 1) >> 0x18,0);
    local_138.vinfo._0_5_ = SUB85(uVar9,0);
    local_138.vinfo.virtualPos.xp.m_i._1_3_ = (undefined3)((uint)uVar9._4_4_ >> 8);
    local_138.vinfo.output.name.d.d = (args->vinfo).output.name.d.d;
    local_138.vinfo.output.name.d.ptr = (args->vinfo).output.name.d.ptr;
    (args->vinfo).output.name.d.d = (Data *)0x0;
    (args->vinfo).output.name.d.ptr = (char16_t *)0x0;
    local_138.vinfo.output.name.d.size = (args->vinfo).output.name.d.size;
    (args->vinfo).output.name.d.size = 0;
    local_138.vinfo.output.connector_id = (args->vinfo).output.connector_id;
    local_138.vinfo.output.crtc_index = (args->vinfo).output.crtc_index;
    local_138.vinfo.output.crtc_id = (args->vinfo).output.crtc_id;
    local_138.vinfo.output._36_4_ = *(undefined4 *)&(args->vinfo).output.field_0x24;
    local_138.vinfo.output.physical_size.wd = (args->vinfo).output.physical_size.wd;
    local_138.vinfo.output.physical_size.ht = (args->vinfo).output.physical_size.ht;
    local_138.vinfo.output.preferred_mode = (args->vinfo).output.preferred_mode;
    local_138.vinfo.output.mode = (args->vinfo).output.mode;
    local_138.vinfo.output.mode_set = (args->vinfo).output.mode_set;
    local_138.vinfo.output._65_7_ = *(undefined7 *)&(args->vinfo).output.field_0x41;
    local_138.vinfo.output.saved_crtc = (args->vinfo).output.saved_crtc;
    local_138.vinfo.output.modes.d.d = (args->vinfo).output.modes.d.d;
    local_138.vinfo.output.modes.d.ptr = (args->vinfo).output.modes.d.ptr;
    (args->vinfo).output.modes.d.d = (Data *)0x0;
    (args->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    local_138.vinfo.output.modes.d.size = (args->vinfo).output.modes.d.size;
    (args->vinfo).output.modes.d.size = 0;
    local_138.vinfo.output.subpixel = (args->vinfo).output.subpixel;
    local_138.vinfo.output._108_4_ = *(undefined4 *)&(args->vinfo).output.field_0x6c;
    local_138.vinfo.output.dpms_prop = (args->vinfo).output.dpms_prop;
    local_138.vinfo.output.edid_blob = (args->vinfo).output.edid_blob;
    uVar17 = (args->vinfo).output.wants_forced_plane;
    uVar9 = *(undefined8 *)&(args->vinfo).output.field_0x81;
    local_138.vinfo.output._137_3_ = *(undefined3 *)&(args->vinfo).output.field_0x89;
    local_138.vinfo.output.drm_format = (args->vinfo).output.drm_format;
    local_138.vinfo.output.drm_format_requested_by_user =
         (args->vinfo).output.drm_format_requested_by_user;
    local_138.vinfo.output._129_7_ = SUB87(uVar9,0);
    local_138.vinfo.output.forced_plane_set = SUB81((ulong)uVar9 >> 0x38,0);
    local_138.vinfo.output.clone_source.d.d = (args->vinfo).output.clone_source.d.d;
    local_138.vinfo.output.clone_source.d.ptr = (args->vinfo).output.clone_source.d.ptr;
    (args->vinfo).output.clone_source.d.d = (Data *)0x0;
    (args->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
    local_138.vinfo.output.clone_source.d.size = (args->vinfo).output.clone_source.d.size;
    (args->vinfo).output.clone_source.d.size = 0;
    local_138.vinfo.output.available_planes.d.d = (args->vinfo).output.available_planes.d.d;
    local_138.vinfo.output.available_planes.d.ptr = (args->vinfo).output.available_planes.d.ptr;
    (args->vinfo).output.available_planes.d.d = (Data *)0x0;
    (args->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
    local_138.vinfo.output.available_planes.d.size = (args->vinfo).output.available_planes.d.size;
    (args->vinfo).output.available_planes.d.size = 0;
    local_138.vinfo.output.eglfs_plane = (args->vinfo).output.eglfs_plane;
    local_138.vinfo.output.size = (args->vinfo).output.size;
    local_138.vinfo.output.crtcIdPropertyId = (args->vinfo).output.crtcIdPropertyId;
    local_138.vinfo.output.modeIdPropertyId = (args->vinfo).output.modeIdPropertyId;
    local_138.vinfo.output.activePropertyId = (args->vinfo).output.activePropertyId;
    local_138.vinfo.output.mode_blob_id = (args->vinfo).output.mode_blob_id;
    bVar44 = (this->super_QArrayDataPointer<OrderedScreen>).size != 0;
    local_138.screen = pQVar8;
    local_138.vinfo.output.wants_forced_plane = (bool)uVar17;
    QArrayDataPointer<OrderedScreen>::detachAndGrow
              (&this->super_QArrayDataPointer<OrderedScreen>,(uint)(i == 0 && bVar44),1,
               (OrderedScreen **)0x0,(QArrayDataPointer<OrderedScreen> *)0x0);
    qVar43 = local_138.vinfo.output.available_planes.d.size;
    pQVar16 = local_138.vinfo.output.available_planes.d.ptr;
    pDVar15 = local_138.vinfo.output.available_planes.d.d;
    qVar42 = local_138.vinfo.output.clone_source.d.size;
    pcVar41 = local_138.vinfo.output.clone_source.d.ptr;
    pDVar40 = local_138.vinfo.output.clone_source.d.d;
    qVar39 = local_138.vinfo.output.modes.d.size;
    p_Var14 = local_138.vinfo.output.modes.d.ptr;
    pDVar13 = local_138.vinfo.output.modes.d.d;
    qVar12 = local_138.vinfo.output.name.d.size;
    pcVar11 = local_138.vinfo.output.name.d.ptr;
    pDVar10 = local_138.vinfo.output.name.d.d;
    if (i == 0 && bVar44) {
      pOVar7 = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
      pOVar7[-1].screen = pQVar8;
      pOVar7[-1].vinfo.virtualIndex = local_138.vinfo.virtualIndex;
      pOVar7[-1].vinfo.virtualPos.xp =
           (Representation)
           (int)(CONCAT35(local_138.vinfo.virtualPos.xp.m_i._1_3_,local_138.vinfo._0_5_) >> 0x20);
      *(ulong *)((long)&pOVar7[-1].vinfo.virtualPos.xp.m_i + 1) =
           CONCAT53(local_138.vinfo._8_5_,local_138.vinfo.virtualPos.xp.m_i._1_3_);
      local_138.vinfo.output.name.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.name.d.d = pDVar10;
      local_138.vinfo.output.name.d.ptr = (char16_t *)0x0;
      pOVar7[-1].vinfo.output.name.d.ptr = pcVar11;
      local_138.vinfo.output.name.d.size = 0;
      pOVar7[-1].vinfo.output.name.d.size = qVar12;
      pOVar7[-1].vinfo.output.connector_id = local_138.vinfo.output.connector_id;
      pOVar7[-1].vinfo.output.crtc_index = local_138.vinfo.output.crtc_index;
      pOVar7[-1].vinfo.output.crtc_id = local_138.vinfo.output.crtc_id;
      *(undefined4 *)&pOVar7[-1].vinfo.output.field_0x24 = local_138.vinfo.output._36_4_;
      pOVar7[-1].vinfo.output.physical_size.wd = local_138.vinfo.output.physical_size.wd;
      pOVar7[-1].vinfo.output.physical_size.ht = local_138.vinfo.output.physical_size.ht;
      pOVar7[-1].vinfo.output.preferred_mode = local_138.vinfo.output.preferred_mode;
      pOVar7[-1].vinfo.output.mode = local_138.vinfo.output.mode;
      pOVar7[-1].vinfo.output.mode_set = local_138.vinfo.output.mode_set;
      *(undefined7 *)&pOVar7[-1].vinfo.output.field_0x41 = local_138.vinfo.output._65_7_;
      pOVar7[-1].vinfo.output.saved_crtc = local_138.vinfo.output.saved_crtc;
      local_138.vinfo.output.modes.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.modes.d.d = pDVar13;
      local_138.vinfo.output.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar7[-1].vinfo.output.modes.d.ptr = p_Var14;
      local_138.vinfo.output.modes.d.size = 0;
      pOVar7[-1].vinfo.output.modes.d.size = qVar39;
      pOVar7[-1].vinfo.output.subpixel = local_138.vinfo.output.subpixel;
      *(undefined4 *)&pOVar7[-1].vinfo.output.field_0x6c = local_138.vinfo.output._108_4_;
      pOVar7[-1].vinfo.output.dpms_prop = local_138.vinfo.output.dpms_prop;
      pOVar7[-1].vinfo.output.edid_blob = local_138.vinfo.output.edid_blob;
      pOVar7[-1].vinfo.output.wants_forced_plane = local_138.vinfo.output.wants_forced_plane;
      *(int3 *)&pOVar7[-1].vinfo.output.field_0x81 = local_138.vinfo.output._129_3_;
      pOVar7[-1].vinfo.output.forced_plane_id = local_138.vinfo.output.forced_plane_id;
      *(ulong *)&pOVar7[-1].vinfo.output.field_0x81 =
           CONCAT17(local_138.vinfo.output.forced_plane_set,local_138.vinfo.output._129_7_);
      *(undefined3 *)&pOVar7[-1].vinfo.output.field_0x89 = local_138.vinfo.output._137_3_;
      pOVar7[-1].vinfo.output.drm_format = local_138.vinfo.output.drm_format;
      pOVar7[-1].vinfo.output.drm_format_requested_by_user =
           local_138.vinfo.output.drm_format_requested_by_user;
      local_138.vinfo.output.clone_source.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.clone_source.d.d = pDVar40;
      local_138.vinfo.output.clone_source.d.ptr = (char16_t *)0x0;
      pOVar7[-1].vinfo.output.clone_source.d.ptr = pcVar41;
      local_138.vinfo.output.clone_source.d.size = 0;
      pOVar7[-1].vinfo.output.clone_source.d.size = qVar42;
      local_138.vinfo.output.available_planes.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.available_planes.d.d = pDVar15;
      local_138.vinfo.output.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar7[-1].vinfo.output.available_planes.d.ptr = pQVar16;
      local_138.vinfo.output.available_planes.d.size = 0;
      pOVar7[-1].vinfo.output.available_planes.d.size = qVar43;
      pOVar7[-1].vinfo.output.eglfs_plane = local_138.vinfo.output.eglfs_plane;
      pOVar7[-1].vinfo.output.size = local_138.vinfo.output.size;
      pOVar7[-1].vinfo.output.crtcIdPropertyId = local_138.vinfo.output.crtcIdPropertyId;
      pOVar7[-1].vinfo.output.modeIdPropertyId = local_138.vinfo.output.modeIdPropertyId;
      pOVar7[-1].vinfo.output.activePropertyId = local_138.vinfo.output.activePropertyId;
      pOVar7[-1].vinfo.output.mode_blob_id = local_138.vinfo.output.mode_blob_id;
      ppOVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).ptr;
      *ppOVar1 = *ppOVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_188.sourceCopyConstruct = 0;
      local_188.nSource = 0;
      local_188.move = 0;
      local_188.sourceCopyAssign = 0;
      local_188.end = (OrderedScreen *)0x0;
      local_188.last = (OrderedScreen *)0x0;
      local_188.where = (OrderedScreen *)0x0;
      local_188.begin = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
      local_188.size = (this->super_QArrayDataPointer<OrderedScreen>).size;
      local_188.data = &this->super_QArrayDataPointer<OrderedScreen>;
      Inserter::insertOne(&local_188,i,&local_138);
      (local_188.data)->ptr = local_188.begin;
      (local_188.data)->size = local_188.size;
    }
    QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&local_138.vinfo.output.available_planes.d);
    if (&(local_138.vinfo.output.clone_source.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_138.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.vinfo.output.clone_source.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.vinfo.output.clone_source.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_138.vinfo.output.modes.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_138.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.vinfo.output.modes.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.vinfo.output.modes.d.d)->super_QArrayData,0x44,0x10);
      }
    }
    if (&(local_138.vinfo.output.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_138.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.vinfo.output.name.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.vinfo.output.name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<OrderedScreen>).size == i) &&
       (pOVar7 = (this->super_QArrayDataPointer<OrderedScreen>).ptr,
       (pDVar6->super_QArrayData).alloc !=
       ((long)((long)pOVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 8) +
       i)) {
      pOVar7[i].screen = args->screen;
      RVar25.m_i = (args->vinfo).virtualPos.xp.m_i;
      uVar9 = *(undefined8 *)((long)&(args->vinfo).virtualPos.xp.m_i + 1);
      pOVar7[i].vinfo.virtualIndex = (args->vinfo).virtualIndex;
      pOVar7[i].vinfo.virtualPos.xp = (Representation)RVar25.m_i;
      *(undefined8 *)((long)&pOVar7[i].vinfo.virtualPos.xp.m_i + 1) = uVar9;
      pDVar10 = (args->vinfo).output.name.d.d;
      (args->vinfo).output.name.d.d = (Data *)0x0;
      pOVar7[i].vinfo.output.name.d.d = pDVar10;
      pcVar11 = (args->vinfo).output.name.d.ptr;
      (args->vinfo).output.name.d.ptr = (char16_t *)0x0;
      pOVar7[i].vinfo.output.name.d.ptr = pcVar11;
      qVar12 = (args->vinfo).output.name.d.size;
      (args->vinfo).output.name.d.size = 0;
      pOVar7[i].vinfo.output.name.d.size = qVar12;
      uVar26 = (args->vinfo).output.crtc_index;
      uVar9 = *(undefined8 *)&(args->vinfo).output.crtc_id;
      qVar18 = (args->vinfo).output.physical_size.wd;
      qVar19 = (args->vinfo).output.physical_size.ht;
      iVar27 = (args->vinfo).output.preferred_mode;
      iVar28 = (args->vinfo).output.mode;
      uVar20 = *(undefined8 *)&(args->vinfo).output.mode_set;
      pOVar24 = pOVar7 + i;
      (pOVar24->vinfo).output.connector_id = (args->vinfo).output.connector_id;
      (pOVar24->vinfo).output.crtc_index = uVar26;
      *(undefined8 *)(&(pOVar24->vinfo).output.connector_id + 2) = uVar9;
      pQVar3 = &pOVar7[i].vinfo.output.physical_size;
      pQVar3->wd = qVar18;
      pQVar3->ht = qVar19;
      pOVar24 = pOVar7 + i;
      (pOVar24->vinfo).output.preferred_mode = iVar27;
      (pOVar24->vinfo).output.mode = iVar28;
      *(undefined8 *)(&(pOVar24->vinfo).output.preferred_mode + 2) = uVar20;
      pOVar7[i].vinfo.output.saved_crtc = (args->vinfo).output.saved_crtc;
      pDVar13 = (args->vinfo).output.modes.d.d;
      (args->vinfo).output.modes.d.d = (Data *)0x0;
      pOVar7[i].vinfo.output.modes.d.d = pDVar13;
      p_Var14 = (args->vinfo).output.modes.d.ptr;
      (args->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar7[i].vinfo.output.modes.d.ptr = p_Var14;
      qVar12 = (args->vinfo).output.modes.d.size;
      (args->vinfo).output.modes.d.size = 0;
      pOVar7[i].vinfo.output.modes.d.size = qVar12;
      uVar29 = *(undefined4 *)&(args->vinfo).output.field_0x6c;
      p_Var21 = (args->vinfo).output.dpms_prop;
      p_Var22 = (args->vinfo).output.edid_blob;
      uVar9 = *(undefined8 *)&(args->vinfo).output.wants_forced_plane;
      uVar30 = *(undefined3 *)&(args->vinfo).output.field_0x81;
      uVar26 = (args->vinfo).output.forced_plane_id;
      bVar44 = (args->vinfo).output.forced_plane_set;
      uVar20 = *(undefined8 *)&(args->vinfo).output.field_0x89;
      pOVar24 = pOVar7 + i;
      (pOVar24->vinfo).output.subpixel = (args->vinfo).output.subpixel;
      *(undefined4 *)&(pOVar24->vinfo).output.field_0x6c = uVar29;
      *(drmModePropertyPtr *)(&(pOVar24->vinfo).output.subpixel + 2) = p_Var21;
      pp_Var4 = &pOVar7[i].vinfo.output.edid_blob;
      *pp_Var4 = p_Var22;
      pp_Var4[1] = (drmModePropertyBlobPtr)uVar9;
      pOVar24 = pOVar7 + i;
      *(undefined3 *)&(pOVar24->vinfo).output.field_0x81 = uVar30;
      (pOVar24->vinfo).output.forced_plane_id = uVar26;
      (pOVar24->vinfo).output.forced_plane_set = bVar44;
      *(undefined8 *)(&(pOVar24->vinfo).output.field_0x81 + 8) = uVar20;
      pDVar10 = (args->vinfo).output.clone_source.d.d;
      (args->vinfo).output.clone_source.d.d = (Data *)0x0;
      pOVar7[i].vinfo.output.clone_source.d.d = pDVar10;
      pcVar11 = (args->vinfo).output.clone_source.d.ptr;
      (args->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
      pOVar7[i].vinfo.output.clone_source.d.ptr = pcVar11;
      qVar12 = (args->vinfo).output.clone_source.d.size;
      (args->vinfo).output.clone_source.d.size = 0;
      pOVar7[i].vinfo.output.clone_source.d.size = qVar12;
      pDVar15 = (args->vinfo).output.available_planes.d.d;
      (args->vinfo).output.available_planes.d.d = (Data *)0x0;
      pOVar7[i].vinfo.output.available_planes.d.d = pDVar15;
      pQVar16 = (args->vinfo).output.available_planes.d.ptr;
      (args->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar7[i].vinfo.output.available_planes.d.ptr = pQVar16;
      qVar12 = (args->vinfo).output.available_planes.d.size;
      (args->vinfo).output.available_planes.d.size = 0;
      pOVar7[i].vinfo.output.available_planes.d.size = qVar12;
      QVar23 = (args->vinfo).output.size;
      uVar26 = (args->vinfo).output.crtcIdPropertyId;
      uVar31 = (args->vinfo).output.modeIdPropertyId;
      uVar9 = *(undefined8 *)&(args->vinfo).output.activePropertyId;
      ppQVar5 = &pOVar7[i].vinfo.output.eglfs_plane;
      *ppQVar5 = (args->vinfo).output.eglfs_plane;
      *(QSize *)(ppQVar5 + 1) = QVar23;
      pOVar7 = pOVar7 + i;
      (pOVar7->vinfo).output.crtcIdPropertyId = uVar26;
      (pOVar7->vinfo).output.modeIdPropertyId = uVar31;
      *(undefined8 *)(&(pOVar7->vinfo).output.crtcIdPropertyId + 2) = uVar9;
    }
    else {
      if ((i != 0) ||
         (pOVar7 = (this->super_QArrayDataPointer<OrderedScreen>).ptr,
         (OrderedScreen *)
         ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pOVar7))
      goto LAB_0013a0ff;
      pOVar7[-1].screen = args->screen;
      RVar25.m_i = (args->vinfo).virtualPos.xp.m_i;
      uVar9 = *(undefined8 *)((long)&(args->vinfo).virtualPos.xp.m_i + 1);
      pOVar7[-1].vinfo.virtualIndex = (args->vinfo).virtualIndex;
      pOVar7[-1].vinfo.virtualPos.xp = (Representation)RVar25.m_i;
      *(undefined8 *)((long)&pOVar7[-1].vinfo.virtualPos.xp.m_i + 1) = uVar9;
      pDVar10 = (args->vinfo).output.name.d.d;
      (args->vinfo).output.name.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.name.d.d = pDVar10;
      pcVar11 = (args->vinfo).output.name.d.ptr;
      (args->vinfo).output.name.d.ptr = (char16_t *)0x0;
      pOVar7[-1].vinfo.output.name.d.ptr = pcVar11;
      qVar12 = (args->vinfo).output.name.d.size;
      (args->vinfo).output.name.d.size = 0;
      pOVar7[-1].vinfo.output.name.d.size = qVar12;
      uVar26 = (args->vinfo).output.crtc_index;
      uVar31 = (args->vinfo).output.crtc_id;
      uVar29 = *(undefined4 *)&(args->vinfo).output.field_0x24;
      qVar18 = (args->vinfo).output.physical_size.wd;
      qVar19 = (args->vinfo).output.physical_size.ht;
      iVar27 = (args->vinfo).output.preferred_mode;
      iVar28 = (args->vinfo).output.mode;
      bVar44 = (args->vinfo).output.mode_set;
      uVar32 = *(undefined7 *)&(args->vinfo).output.field_0x41;
      pOVar7[-1].vinfo.output.connector_id = (args->vinfo).output.connector_id;
      pOVar7[-1].vinfo.output.crtc_index = uVar26;
      pOVar7[-1].vinfo.output.crtc_id = uVar31;
      *(undefined4 *)&pOVar7[-1].vinfo.output.field_0x24 = uVar29;
      pOVar7[-1].vinfo.output.physical_size.wd = qVar18;
      pOVar7[-1].vinfo.output.physical_size.ht = qVar19;
      pOVar7[-1].vinfo.output.preferred_mode = iVar27;
      pOVar7[-1].vinfo.output.mode = iVar28;
      pOVar7[-1].vinfo.output.mode_set = bVar44;
      *(undefined7 *)&pOVar7[-1].vinfo.output.field_0x41 = uVar32;
      pOVar7[-1].vinfo.output.saved_crtc = (args->vinfo).output.saved_crtc;
      pDVar13 = (args->vinfo).output.modes.d.d;
      (args->vinfo).output.modes.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.modes.d.d = pDVar13;
      p_Var14 = (args->vinfo).output.modes.d.ptr;
      (args->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar7[-1].vinfo.output.modes.d.ptr = p_Var14;
      qVar12 = (args->vinfo).output.modes.d.size;
      (args->vinfo).output.modes.d.size = 0;
      pOVar7[-1].vinfo.output.modes.d.size = qVar12;
      uVar29 = *(undefined4 *)&(args->vinfo).output.field_0x6c;
      p_Var21 = (args->vinfo).output.dpms_prop;
      p_Var22 = (args->vinfo).output.edid_blob;
      bVar44 = (args->vinfo).output.wants_forced_plane;
      uVar30 = *(undefined3 *)&(args->vinfo).output.field_0x81;
      uVar26 = (args->vinfo).output.forced_plane_id;
      uVar33 = *(undefined3 *)&(args->vinfo).output.field_0x81;
      uVar31 = (args->vinfo).output.forced_plane_id;
      bVar34 = (args->vinfo).output.forced_plane_set;
      uVar35 = *(undefined3 *)&(args->vinfo).output.field_0x89;
      uVar36 = (args->vinfo).output.drm_format;
      bVar37 = (args->vinfo).output.drm_format_requested_by_user;
      pOVar7[-1].vinfo.output.subpixel = (args->vinfo).output.subpixel;
      *(undefined4 *)&pOVar7[-1].vinfo.output.field_0x6c = uVar29;
      pOVar7[-1].vinfo.output.dpms_prop = p_Var21;
      pOVar7[-1].vinfo.output.edid_blob = p_Var22;
      pOVar7[-1].vinfo.output.wants_forced_plane = bVar44;
      *(undefined3 *)&pOVar7[-1].vinfo.output.field_0x81 = uVar30;
      pOVar7[-1].vinfo.output.forced_plane_id = uVar26;
      *(undefined3 *)&pOVar7[-1].vinfo.output.field_0x81 = uVar33;
      pOVar7[-1].vinfo.output.forced_plane_id = uVar31;
      pOVar7[-1].vinfo.output.forced_plane_set = bVar34;
      *(undefined3 *)&pOVar7[-1].vinfo.output.field_0x89 = uVar35;
      pOVar7[-1].vinfo.output.drm_format = uVar36;
      pOVar7[-1].vinfo.output.drm_format_requested_by_user = bVar37;
      pDVar10 = (args->vinfo).output.clone_source.d.d;
      (args->vinfo).output.clone_source.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.clone_source.d.d = pDVar10;
      pcVar11 = (args->vinfo).output.clone_source.d.ptr;
      (args->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
      pOVar7[-1].vinfo.output.clone_source.d.ptr = pcVar11;
      qVar12 = (args->vinfo).output.clone_source.d.size;
      (args->vinfo).output.clone_source.d.size = 0;
      pOVar7[-1].vinfo.output.clone_source.d.size = qVar12;
      pDVar15 = (args->vinfo).output.available_planes.d.d;
      (args->vinfo).output.available_planes.d.d = (Data *)0x0;
      pOVar7[-1].vinfo.output.available_planes.d.d = pDVar15;
      pQVar16 = (args->vinfo).output.available_planes.d.ptr;
      (args->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar7[-1].vinfo.output.available_planes.d.ptr = pQVar16;
      qVar12 = (args->vinfo).output.available_planes.d.size;
      (args->vinfo).output.available_planes.d.size = 0;
      pOVar7[-1].vinfo.output.available_planes.d.size = qVar12;
      QVar23 = (args->vinfo).output.size;
      uVar26 = (args->vinfo).output.crtcIdPropertyId;
      uVar31 = (args->vinfo).output.modeIdPropertyId;
      uVar36 = (args->vinfo).output.activePropertyId;
      uVar38 = (args->vinfo).output.mode_blob_id;
      pOVar7[-1].vinfo.output.eglfs_plane = (args->vinfo).output.eglfs_plane;
      pOVar7[-1].vinfo.output.size = QVar23;
      pOVar7[-1].vinfo.output.crtcIdPropertyId = uVar26;
      pOVar7[-1].vinfo.output.modeIdPropertyId = uVar31;
      pOVar7[-1].vinfo.output.activePropertyId = uVar36;
      pOVar7[-1].vinfo.output.mode_blob_id = uVar38;
      ppOVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }